

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

void FreeTSInfo(void *ClientData)

{
  if (*ClientData != 0) {
    free_FFSBuffer();
  }
  if (*(long *)((long)ClientData + 8) != 0) {
    free_FFSBuffer();
  }
  free(ClientData);
  return;
}

Assistant:

static void FreeTSInfo(void *ClientData)
{
    FFSTimestepInfo TSInfo = (FFSTimestepInfo)ClientData;
    if (TSInfo->MetaEncodeBuffer)
        free_FFSBuffer(TSInfo->MetaEncodeBuffer);
    if (TSInfo->DataEncodeBuffer)
        no_tsan_free_FFSBuffer(TSInfo->DataEncodeBuffer);
    free(TSInfo);
}